

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O1

bool __thiscall BamTools::Internal::BamFtp::ConnectDataSocket(BamFtp *this)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  undefined8 *puVar4;
  long *plVar5;
  long lVar6;
  size_type *psVar7;
  ulong uVar8;
  string restartCommand;
  __string_type __str_1;
  __string_type __str;
  string passiveCommand;
  string retrieveCommand;
  string local_250;
  undefined8 *local_230;
  ulong local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  ulong *local_210;
  ulong local_208;
  ulong local_200 [2];
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0 [4];
  ios_base local_130 [264];
  
  bVar3 = TcpSocket::IsConnected(this->m_commandSocket);
  if ((!bVar3) && (bVar3 = ConnectCommandSocket(this), !bVar3)) {
    return false;
  }
  bVar3 = TcpSocket::IsConnected(this->m_dataSocket);
  if (bVar3) {
    TcpSocket::DisconnectFromHost(this->m_dataSocket);
  }
  std::operator+(&local_1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 PASV_CMD_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &FTP_NEWLINE_abi_cxx11_);
  bVar3 = SendCommand(this,&local_1d0,true);
  if ((!bVar3) || (bVar3 = ParsePassiveResponse(this), !bVar3)) {
LAB_0014814e:
    bVar3 = false;
    goto LAB_00148150;
  }
  paVar2 = &local_250.field_2;
  if (-1 < this->m_filePosition) {
    local_250._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"");
    std::__cxx11::stringstream::stringstream
              ((stringstream *)local_1b0,(string *)&local_250,_S_out|_S_in);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    std::ostream::_M_insert<long>((long)&local_1b0[0].field_2);
    local_210 = local_200;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,REST_CMD_abi_cxx11_,DAT_0016e878 + REST_CMD_abi_cxx11_);
    std::__cxx11::string::_M_replace_aux((ulong)&local_210,local_208,0,'\x01');
    std::__cxx11::stringbuf::str();
    uVar8 = 0xf;
    if (local_210 != local_200) {
      uVar8 = local_200[0];
    }
    if (uVar8 < local_1e8 + local_208) {
      uVar8 = 0xf;
      if (local_1f0 != local_1e0) {
        uVar8 = local_1e0[0];
      }
      if (uVar8 < local_1e8 + local_208) goto LAB_00147f8f;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210);
    }
    else {
LAB_00147f8f:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1f0);
    }
    local_230 = &local_220;
    puVar1 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar1) {
      local_220 = *puVar1;
      uStack_218 = puVar4[3];
    }
    else {
      local_220 = *puVar1;
      local_230 = (undefined8 *)*puVar4;
    }
    local_228 = puVar4[1];
    *puVar4 = puVar1;
    puVar4[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_230,FTP_NEWLINE_abi_cxx11_);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_250.field_2._M_allocated_capacity = *psVar7;
      local_250.field_2._8_8_ = plVar5[3];
      local_250._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_250.field_2._M_allocated_capacity = *psVar7;
      local_250._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_250._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0);
    }
    if (local_210 != local_200) {
      operator_delete(local_210);
    }
    bVar3 = SendCommand(this,&local_250,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
    if (!bVar3) goto LAB_0014814e;
  }
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,RETR_CMD_abi_cxx11_,DAT_0016e898 + RETR_CMD_abi_cxx11_);
  std::__cxx11::string::_M_replace_aux((ulong)&local_230,local_228,0,'\x01');
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&local_230,(ulong)(this->m_filename)._M_dataplus._M_p);
  psVar7 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_250.field_2._M_allocated_capacity = *psVar7;
    local_250.field_2._8_8_ = puVar4[3];
    local_250._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_250.field_2._M_allocated_capacity = *psVar7;
    local_250._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_250._M_string_length = puVar4[1];
  *puVar4 = psVar7;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_250,FTP_NEWLINE_abi_cxx11_);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_1b0[0].field_2._0_8_ = *psVar7;
    local_1b0[0].field_2._8_8_ = plVar5[3];
    local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
  }
  else {
    local_1b0[0].field_2._0_8_ = *psVar7;
    local_1b0[0]._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1b0[0]._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  bVar3 = SendCommand(this,local_1b0,false);
  if ((bVar3) &&
     (bVar3 = TcpSocket::ConnectToHost
                        (this->m_dataSocket,&this->m_dataHostname,this->m_dataPort,ReadOnly), bVar3)
     ) {
    bVar3 = ReceiveReply(this);
    if (!bVar3) {
LAB_001482a9:
      TcpSocket::DisconnectFromHost(this->m_dataSocket);
      goto LAB_001482b2;
    }
    local_250._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"150","");
    lVar6 = std::__cxx11::string::find
                      ((char *)&this->m_response,(ulong)local_250._M_dataplus._M_p,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if (lVar6 != 0) goto LAB_001482a9;
    bVar3 = true;
  }
  else {
LAB_001482b2:
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
LAB_00148150:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool BamFtp::ConnectDataSocket(void) {

    // failure if can't connect to command socket first
    if ( !m_commandSocket->IsConnected() ) {
        if ( !ConnectCommandSocket() )
            return false;
    }

    // make sure we're starting with a fresh data channel
    if ( m_dataSocket->IsConnected() )
        m_dataSocket->DisconnectFromHost();

    // send passive connection command
    const string passiveCommand = PASV_CMD + FTP_NEWLINE;
    if ( !SendCommand(passiveCommand, true) ) {
        // TODO: set error string
        return false;
    }

    // retrieve passive connection port
    if ( !ParsePassiveResponse() ) {
        // TODO: set error string
        return false;
    }

    // set up restart command (tell server where to start fetching bytes from)
    if ( m_filePosition >= 0 ) {

        stringstream fpStream("");
        fpStream << m_filePosition;
        string restartCommand = REST_CMD + CMD_SEPARATOR + fpStream.str() + FTP_NEWLINE;
        if ( !SendCommand(restartCommand, true) ) {
            // TODO: set error string
            return false;
        }
    }

    // main file retrieval request
    string retrieveCommand = RETR_CMD + CMD_SEPARATOR + m_filename + FTP_NEWLINE;
    if ( !SendCommand(retrieveCommand, false) ) {
        // TODO: set error string
        return false;
    }

    // make data channel connection
    if ( !m_dataSocket->ConnectToHost(m_dataHostname, m_dataPort) ) {
        // TODO: set error string
        return false;
    }

    // fetch intial reply from server
    if ( !ReceiveReply() ) {
        // TODO: set error string
        m_dataSocket->DisconnectFromHost();
        return false;
    }

    // make sure we have reply code 150 (all good)
    if ( !startsWith(m_response, "150") ) {
        // TODO: set error string
        m_dataSocket->DisconnectFromHost();
        return false;
    }

    // return success
    return true;
}